

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_io.cc
# Opt level: O2

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
draco::ReadMeshFromFile
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
           *__return_storage_ptr__,string *file_name,Options *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mesh_files)

{
  bool bVar1;
  Mesh *this;
  DecoderBuffer buffer;
  string extension;
  vector<char,_std::allocator<char>_> file_data;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> statusor;
  Decoder decoder;
  allocator<char> local_261;
  undefined1 local_260 [24];
  BitDecoder local_248;
  string local_228;
  _Vector_base<char,_std::allocator<char>_> local_208;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> local_1e8;
  string local_1b8 [32];
  undefined1 local_198 [40];
  undefined1 local_170 [24];
  BitDecoder local_158 [9];
  bool local_80;
  bool local_7f;
  
  this = (Mesh *)operator_new(0xd8);
  Mesh::Mesh(this);
  LowercaseFileExtension(&local_228,file_name);
  bVar1 = std::operator!=(&local_228,"gltf");
  if (bVar1) {
    bVar1 = std::operator!=(&local_228,"obj");
    if (bVar1 && mesh_files !=
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(mesh_files,file_name);
    }
  }
  bVar1 = std::operator==(&local_228,"obj");
  if (bVar1) {
    ObjDecoder::ObjDecoder((ObjDecoder *)local_170);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_260,"use_metadata",(allocator<char> *)&local_1e8);
    local_80 = Options::GetBool(options,(string *)local_260,false);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_260,"preserve_polygons",(allocator<char> *)&local_1e8);
    local_7f = Options::GetBool(options,(string *)local_260);
    std::__cxx11::string::~string((string *)local_260);
    ObjDecoder::DecodeFromFile
              ((Status *)local_260,(ObjDecoder *)local_170,file_name,this,mesh_files);
    if (local_260._0_4_ == OK) {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
      super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
      super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = this;
      this = (Mesh *)0x0;
    }
    else {
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                (__return_storage_ptr__,(Status *)local_260);
    }
    std::__cxx11::string::~string((string *)(local_260 + 8));
    ObjDecoder::~ObjDecoder((ObjDecoder *)local_170);
  }
  else {
    bVar1 = std::operator==(&local_228,"ply");
    if (bVar1) {
      PlyDecoder::PlyDecoder((PlyDecoder *)local_170);
      PlyDecoder::DecodeFromFile((Status *)local_260,(PlyDecoder *)local_170,file_name,this);
      if (local_260._0_4_ == OK) {
        std::__cxx11::string::~string((string *)(local_260 + 8));
        (__return_storage_ptr__->status_).code_ = OK;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
        (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
        super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
        super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = this;
        this = (Mesh *)0x0;
      }
      else {
        StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                  (__return_storage_ptr__,(Status *)local_260);
        std::__cxx11::string::~string((string *)(local_260 + 8));
      }
      DecoderBuffer::BitDecoder::~BitDecoder(local_158);
    }
    else {
      bVar1 = std::operator==(&local_228,"stl");
      if (bVar1) {
        StlDecoder::DecodeFromFile(__return_storage_ptr__,(StlDecoder *)local_170,file_name);
      }
      else {
        local_208._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
        local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar1 = ReadFileToBuffer(file_name,(vector<char,_std::allocator<char>_> *)&local_208);
        if (bVar1) {
          DecoderBuffer::DecoderBuffer((DecoderBuffer *)local_260);
          DecoderBuffer::Init((DecoderBuffer *)local_260,
                              local_208._M_impl.super__Vector_impl_data._M_start,
                              (long)local_208._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_208._M_impl.super__Vector_impl_data._M_start);
          Decoder::Decoder((Decoder *)local_170);
          Decoder::DecodeMeshFromBuffer(&local_1e8,(Decoder *)local_170,(DecoderBuffer *)local_260);
          if ((local_1e8.status_.code_ == OK) &&
             (local_1e8.value_._M_t.
              super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
              super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
              super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)0x0)) {
            (__return_storage_ptr__->status_).code_ = OK;
            (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
            (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
            (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
            (__return_storage_ptr__->value_)._M_t.
            super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
            super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
            super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
                 (Mesh *)local_1e8.value_._M_t.
                         super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
                         super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
                         super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl;
            local_1e8.value_._M_t.
            super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
            super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
            super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
                 (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)
                 (__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)0x0;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1b8,"Error decoding input.",&local_261);
            local_198._0_4_ = DRACO_ERROR;
            std::__cxx11::string::string((string *)(local_198 + 8),local_1b8);
            StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                      (__return_storage_ptr__,(Status *)local_198);
            std::__cxx11::string::~string((string *)(local_198 + 8));
            std::__cxx11::string::~string(local_1b8);
          }
          StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::~StatusOr
                    (&local_1e8);
          Decoder::~Decoder((Decoder *)local_170);
          DecoderBuffer::BitDecoder::~BitDecoder(&local_248);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_260,"Unable to read input file.",(allocator<char> *)&local_1e8)
          ;
          local_170._0_4_ = DRACO_ERROR;
          std::__cxx11::string::string((string *)(local_170 + 8),(string *)local_260);
          StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                    (__return_storage_ptr__,(Status *)local_170);
          std::__cxx11::string::~string((string *)(local_170 + 8));
          std::__cxx11::string::~string((string *)local_260);
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_208);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_228);
  if (this != (Mesh *)0x0) {
    (*(this->super_PointCloud)._vptr_PointCloud[1])(this);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> ReadMeshFromFile(
    const std::string &file_name, const Options &options,
    std::vector<std::string> *mesh_files) {
  std::unique_ptr<Mesh> mesh(new Mesh());
  // Analyze file extension.
  const std::string extension = LowercaseFileExtension(file_name);
  if (extension != "gltf" && extension != "obj" && mesh_files) {
    // The GLTF/OBJ decoder will fill |mesh_files|, but for other file types we
    // set the root file here to avoid duplicating code.
    mesh_files->push_back(file_name);
  }
  if (extension == "obj") {
    // Wavefront OBJ file format.
    ObjDecoder obj_decoder;
    obj_decoder.set_use_metadata(options.GetBool("use_metadata", false));
    obj_decoder.set_preserve_polygons(options.GetBool("preserve_polygons"));
    const Status obj_status =
        obj_decoder.DecodeFromFile(file_name, mesh.get(), mesh_files);
    if (!obj_status.ok()) {
      return obj_status;
    }
    return std::move(mesh);
  }
  if (extension == "ply") {
    // Stanford PLY file format.
    PlyDecoder ply_decoder;
    DRACO_RETURN_IF_ERROR(ply_decoder.DecodeFromFile(file_name, mesh.get()));
    return std::move(mesh);
  }
  if (extension == "stl") {
    // STL file format.
    StlDecoder stl_decoder;
    return stl_decoder.DecodeFromFile(file_name);
  }
#ifdef DRACO_TRANSCODER_SUPPORTED
  if (extension == "gltf" || extension == "glb") {
    GltfDecoder gltf_decoder;
    return gltf_decoder.DecodeFromFile(file_name, mesh_files);
  }
#endif

  // Otherwise not an obj file. Assume the file was encoded with one of the
  // draco encoding methods.
  std::vector<char> file_data;
  if (!ReadFileToBuffer(file_name, &file_data)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer buffer;
  buffer.Init(file_data.data(), file_data.size());
  Decoder decoder;
  auto statusor = decoder.DecodeMeshFromBuffer(&buffer);
  if (!statusor.ok() || statusor.value() == nullptr) {
    return Status(Status::DRACO_ERROR, "Error decoding input.");
  }
  return std::move(statusor).value();
}